

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateGarfieldGasTableForLiquidNoble.cpp
# Opt level: O2

tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_double,_bool,_double>
* ParseInput_abi_cxx11_
            (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_double,_bool,_double>
             *__return_storage_ptr__,int argc,char **argv)

{
  _Tuple_impl<5UL,_double> _Var1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_double,_bool,_double>
  *failure;
  char *pcVar5;
  string medium;
  allocator<char> local_59;
  double local_58;
  double local_50;
  string local_48 [32];
  
  if (argc == 7) {
    if (*argv[1] != 'L') {
      std::__cxx11::string::string<std::allocator<char>>(local_48,argv[1],&local_59);
      iVar2 = atoi(argv[2]);
      local_50 = atof(argv[3]);
      local_58 = atof(argv[4]);
      iVar3 = atoi(argv[5]);
      _Var1.super__Head_base<5UL,_double,_false>._M_head_impl =
           (_Head_base<5UL,_double,_false>)atof(argv[6]);
      (__return_storage_ptr__->
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_double,_bool,_double>
      ).super__Tuple_impl<1UL,_int,_double,_double,_bool,_double>.
      super__Tuple_impl<2UL,_double,_double,_bool,_double>.
      super__Tuple_impl<3UL,_double,_bool,_double>.super__Tuple_impl<4UL,_bool,_double>.
      super__Tuple_impl<5UL,_double>.super__Head_base<5UL,_double,_false> =
           _Var1.super__Head_base<5UL,_double,_false>._M_head_impl;
      (__return_storage_ptr__->
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_double,_bool,_double>
      ).super__Tuple_impl<1UL,_int,_double,_double,_bool,_double>.
      super__Tuple_impl<2UL,_double,_double,_bool,_double>.
      super__Tuple_impl<3UL,_double,_bool,_double>.super__Tuple_impl<4UL,_bool,_double>.
      super__Head_base<4UL,_bool,_false>._M_head_impl = iVar3 != 0;
      (__return_storage_ptr__->
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_double,_bool,_double>
      ).super__Tuple_impl<1UL,_int,_double,_double,_bool,_double>.
      super__Tuple_impl<2UL,_double,_double,_bool,_double>.
      super__Tuple_impl<3UL,_double,_bool,_double>.super__Head_base<3UL,_double,_false>._M_head_impl
           = local_58;
      (__return_storage_ptr__->
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_double,_bool,_double>
      ).super__Tuple_impl<1UL,_int,_double,_double,_bool,_double>.
      super__Tuple_impl<2UL,_double,_double,_bool,_double>.super__Head_base<2UL,_double,_false>.
      _M_head_impl = local_50;
      (__return_storage_ptr__->
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_double,_bool,_double>
      ).super__Tuple_impl<1UL,_int,_double,_double,_bool,_double>.super__Head_base<1UL,_int,_false>.
      _M_head_impl = iVar2;
      std::__cxx11::string::string
                ((string *)
                 &(__return_storage_ptr__->
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_double,_bool,_double>
                  ).
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                 ,local_48);
      std::__cxx11::string::~string(local_48);
      return __return_storage_ptr__;
    }
    pcVar5 = 
    "----> Input Error? Input format of element should be \'Xe\' or \'Ar\', not \'LXe\' or \'LAr.\' Please leave the \'L\' out."
    ;
  }
  else {
    pcVar5 = 
    "----> Input Error! Input format should be: ./GenerateGasTable <Element> <nFieldPoints> <minField_VoltsPerCm> <maxField_VoltsPerCm> <Logarithmic:0or1> <Temperature_K>"
    ;
  }
  poVar4 = std::operator<<((ostream *)&std::cout,pcVar5);
  std::endl<char,std::char_traits<char>>(poVar4);
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_double,_bool,_double>
  ).super__Tuple_impl<1UL,_int,_double,_double,_bool,_double>.
  super__Tuple_impl<2UL,_double,_double,_bool,_double>.super__Tuple_impl<3UL,_double,_bool,_double>.
  super__Tuple_impl<4UL,_bool,_double>.super__Tuple_impl<5UL,_double>.
  super__Head_base<5UL,_double,_false> = (_Head_base<5UL,_double,_false>)0x0;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_double,_bool,_double>
  ).super__Tuple_impl<1UL,_int,_double,_double,_bool,_double>.
  super__Tuple_impl<2UL,_double,_double,_bool,_double>.super__Tuple_impl<3UL,_double,_bool,_double>.
  super__Tuple_impl<4UL,_bool,_double>.super__Head_base<4UL,_bool,_false>._M_head_impl = false;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_double,_bool,_double>
  ).super__Tuple_impl<1UL,_int,_double,_double,_bool,_double>.super__Head_base<1UL,_int,_false>.
  _M_head_impl = 0;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_double,_bool,_double>
  ).super__Tuple_impl<1UL,_int,_double,_double,_bool,_double>.
  super__Tuple_impl<2UL,_double,_double,_bool,_double>.super__Tuple_impl<3UL,_double,_bool,_double>.
  super__Head_base<3UL,_double,_false>._M_head_impl = 0.0;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_double,_bool,_double>
  ).super__Tuple_impl<1UL,_int,_double,_double,_bool,_double>.
  super__Tuple_impl<2UL,_double,_double,_bool,_double>.super__Head_base<2UL,_double,_false>.
  _M_head_impl = 0.0;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_double,_bool,_double>
  ).
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ._M_head_impl._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_double,_bool,_double>
                 ).
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                 ._M_head_impl.field_2;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_double,_bool,_double>
  ).
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ._M_head_impl._M_string_length = 0;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_double,_bool,_double>
  ).
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ._M_head_impl.field_2._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::tuple<std::string, int, double, double, bool, double> ParseInput(
    int argc, char** argv) {
  // Sanity check
  if (argc != 7) {
    std::cout
        << "----> Input Error! Input format should be: ./GenerateGasTable "
           "<Element> <nFieldPoints> <minField_VoltsPerCm> "
           "<maxField_VoltsPerCm> <Logarithmic:0or1> <Temperature_K>"
        << std::endl;
    std::tuple<std::string, int, double, double, bool, double> failure;
    return failure;
  }
  if (argv[1][0] == 'L') {
    std::cout << "----> Input Error? Input format of element should be 'Xe' or "
                 "'Ar', not 'LXe' or 'LAr.' Please leave the 'L' out."
              << std::endl;
    std::tuple<std::string, int, double, double, bool, double> failure;
    return failure;
  }

  // Start extracting things
  std::string medium(argv[1]);
  int fieldPoints = atoi(argv[2]);
  double minField = atof(argv[3]);
  double maxField = atof(argv[4]);
  int logarithmic = atoi(argv[5]);
  bool boolLog;
  double temperature = atof(argv[6]);

  if (logarithmic == 0) {
    boolLog = false;
  } else {
    boolLog = true;
  }
  std::tuple<std::string, int, double, double, bool, double> output(
      medium, fieldPoints, minField, maxField, boolLog, temperature);
  return output;
}